

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

bool __thiscall Json::Value::CZString::operator==(CZString *this,CZString *other)

{
  int iVar1;
  undefined8 *in_RSI;
  long *in_RDI;
  int comp;
  uint other_len;
  uint this_len;
  bool local_1;
  
  if (*in_RDI == 0) {
    local_1 = (int)in_RDI[1] == *(int *)(in_RSI + 1);
  }
  else if (*(uint *)(in_RDI + 1) >> 2 == *(uint *)(in_RSI + 1) >> 2) {
    iVar1 = memcmp((void *)*in_RDI,(void *)*in_RSI,(ulong)(*(uint *)(in_RDI + 1) >> 2));
    local_1 = iVar1 == 0;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Value::CZString::operator==(const CZString& other) const {
  if (!cstr_) return index_ == other.index_;
  //return strcmp(cstr_, other.cstr_) == 0;
  // Assume both are strings.
  unsigned this_len = this->storage_.length_;
  unsigned other_len = other.storage_.length_;
  if (this_len != other_len) return false;
  int comp = memcmp(this->cstr_, other.cstr_, this_len);
  return comp == 0;
}